

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

void __thiscall pbrt::Bounds2<int>::Bounds2(Bounds2<int> *this,Point2<int> *p1,Point2<int> *p2)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  Tuple2<pbrt::Point2,_int> *in_RDX;
  Tuple2<pbrt::Point2,_int> *in_RDI;
  
  TVar1 = (Tuple2<pbrt::Point2,_int>)Min<pbrt::Point2,int>(in_RDX,in_RDI);
  *in_RDI = TVar1;
  TVar1 = (Tuple2<pbrt::Point2,_int>)Max<pbrt::Point2,int>(in_RDX,in_RDI);
  in_RDI[1] = TVar1;
  return;
}

Assistant:

PBRT_CPU_GPU explicit Bounds2(const Bounds2<U> &b) {
        if (b.IsEmpty())
            // Be careful about overflowing float->int conversions and the
            // like.
            *this = Bounds2<T>();
        else {
            pMin = Point2<T>(b.pMin);
            pMax = Point2<T>(b.pMax);
        }
    }